

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int convert_RGB_to_YCoCg(uchar *orig,int width,int height,int channels)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uchar uVar5;
  uint uVar6;
  
  iVar1 = -1;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0xfffffffd < channels - 5U)) {
    if (channels == 3) {
      uVar3 = 0;
      do {
        uVar4 = orig[uVar3 + 1] + 1 >> 1;
        uVar2 = (uint)orig[uVar3] + (uint)orig[uVar3 + 2] + 2 >> 2;
        uVar6 = ((int)(((uint)orig[uVar3] - (uint)orig[uVar3 + 2]) + 1) >> 1) + 0x80;
        uVar5 = (uchar)uVar6;
        if (0xfe < uVar6) {
          uVar5 = 0xff;
        }
        orig[uVar3] = uVar5;
        uVar6 = uVar2 + uVar4;
        if (0xfe < uVar6) {
          uVar6 = 0xff;
        }
        uVar2 = (uVar4 - uVar2) + 0x80;
        if (0xfe < uVar2) {
          uVar2 = 0xff;
        }
        orig[uVar3 + 1] = (uchar)uVar6;
        orig[uVar3 + 2] = (uchar)uVar2;
        uVar3 = uVar3 + 3;
      } while (uVar3 < (uint)(height * width * 3));
    }
    else {
      uVar3 = 0;
      do {
        uVar6 = orig[uVar3 + 1] + 1 >> 1;
        uVar2 = (uint)orig[uVar3] + (uint)orig[uVar3 + 2] + 2 >> 2;
        uVar4 = ((int)(((uint)orig[uVar3] - (uint)orig[uVar3 + 2]) + 1) >> 1) + 0x80;
        uVar5 = (uchar)uVar4;
        if (0xfe < uVar4) {
          uVar5 = 0xff;
        }
        orig[uVar3] = uVar5;
        uVar4 = (uVar6 - uVar2) + 0x80;
        uVar5 = (uchar)uVar4;
        if (0xfe < uVar4) {
          uVar5 = 0xff;
        }
        orig[uVar3 + 1] = uVar5;
        uVar2 = uVar2 + uVar6;
        if (0xfe < uVar2) {
          uVar2 = 0xff;
        }
        orig[uVar3 + 2] = orig[uVar3 + 3];
        orig[uVar3 + 3] = (uchar)uVar2;
        uVar3 = uVar3 + 4;
      } while (uVar3 < (uint)(height * width * 4));
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
	convert_RGB_to_YCoCg
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int r = orig[i+0];
			int g = (orig[i+1] + 1) >> 1;
			int b = orig[i+2];
			int tmp = (2 + r + b) >> 2;
			/*	Co	*/
			orig[i+0] = clamp_byte( 128 + ((r - b + 1) >> 1) );
			/*	Y	*/
			orig[i+1] = clamp_byte( g + tmp );
			/*	Cg	*/
			orig[i+2] = clamp_byte( 128 + g - tmp );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int r = orig[i+0];
			int g = (orig[i+1] + 1) >> 1;
			int b = orig[i+2];
			unsigned char a = orig[i+3];
			int tmp = (2 + r + b) >> 2;
			/*	Co	*/
			orig[i+0] = clamp_byte( 128 + ((r - b + 1) >> 1) );
			/*	Cg	*/
			orig[i+1] = clamp_byte( 128 + g - tmp );
			/*	Alpha	*/
			orig[i+2] = a;
			/*	Y	*/
			orig[i+3] = clamp_byte( g + tmp );
		}
	}
	/*	done	*/
	return 0;
}